

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureSpecificationTests::init
          (TextureSpecificationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  char *pcVar4;
  TexImageCubeArrayBufferCase *pTVar5;
  long lVar6;
  TexSubImageCubeArrayBufferCase *pTVar7;
  ulong extraout_RAX;
  ulong uVar8;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  allocator<char> local_849;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  undefined1 local_748 [8];
  string name;
  int local_720;
  int levels;
  int layers;
  int size;
  deUint32 format_2;
  int ndx_6;
  TestCaseGroup *sizeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  int local_6c0;
  undefined4 local_6bc;
  int texCubeArrayLevels_1;
  int texCubeArrayLayers_3;
  int texCubeArraySize_6;
  deUint32 internalFormat_1;
  char *fmtName_3;
  int formatNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  int local_660;
  undefined4 local_65c;
  int texCubeArrayLevels;
  int texCubeArrayLayers_2;
  int texCubeArraySize_5;
  deUint32 internalFormat;
  char *fmtName_2;
  TestNode *pTStack_640;
  int formatNdx_2;
  TestCaseGroup *formatGroup;
  TestCaseGroup *texStorageGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  undefined4 local_5e4;
  undefined4 local_5e0;
  int texCubeArrayLayers_1;
  int texCubeArraySize_4;
  int ndx_5;
  TestCaseGroup *shadow3dGroup_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  int local_588;
  undefined1 local_582;
  allocator<char> local_581;
  int ndx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  int local_53c;
  TestNode *pTStack_538;
  int ndx_3;
  TestCaseGroup *pboGroup_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined4 local_4e4;
  undefined4 local_4e0;
  int texCubeArrayDepth_1;
  int texCubeArraySize_3;
  int ndx_2;
  TestCaseGroup *shadow3dGroup_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined4 local_484;
  undefined4 local_480;
  int texCubeArrayDepth;
  int texCubeArraySize_2;
  int ndx_1;
  TestCaseGroup *shadow3dGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  int local_428;
  undefined1 local_421;
  int ndx;
  undefined4 local_400;
  undefined4 local_3fc;
  int texCubeDepth;
  int texCubeArraySize_1;
  deUint32 format_1;
  string fmtName_1;
  int formatNdx_1;
  TestCaseGroup *pboGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined4 local_374;
  undefined4 local_370;
  int texCubeArrayLayers;
  int texCubeArraySize;
  deUint32 format;
  char *fmtName;
  int formatNdx;
  TestNode *local_350;
  TestCaseGroup *basicTexImageGroup;
  anon_struct_16_2_e82303c2 colorFormats [49];
  TextureSpecificationTests *this_local;
  
  colorFormats[0x30]._8_8_ = this;
  memcpy(&basicTexImageGroup,&PTR_anon_var_dwarf_2593d9_032c54f0,0x310);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_teximage3d","Basic glTexImage3D() usage");
  local_350 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (fmtName._0_4_ = 0; pTVar2 = local_350, (int)fmtName < 0x31; fmtName._0_4_ = (int)fmtName + 1)
  {
    _texCubeArraySize = *(char **)&colorFormats[(long)(int)fmtName + -1].internalFormat;
    texCubeArrayLayers = *(int *)&colorFormats[(int)fmtName].name;
    local_370 = 0x40;
    local_374 = 6;
    pTVar3 = (TestNode *)operator_new(0xd8);
    pcVar4 = _texCubeArraySize;
    pboGroup._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,pcVar4,(allocator<char> *)((long)&pboGroup + 7));
    std::operator+(&local_398,&local_3b8,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    BasicTexImageCubeArrayCase::BasicTexImageCubeArrayCase
              ((BasicTexImageCubeArrayCase *)pTVar3,pCVar1,pcVar4,"",texCubeArrayLayers,0x40,6);
    pboGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pboGroup + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_pbo","glTexImage3D() from PBO");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (fmtName_1.field_2._12_4_ = 0; (int)fmtName_1.field_2._12_4_ < 0x31;
      fmtName_1.field_2._12_4_ = fmtName_1.field_2._12_4_ + 1) {
    pcVar4 = *(char **)&colorFormats[(long)(int)fmtName_1.field_2._12_4_ + -1].internalFormat;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&format_1,pcVar4,(allocator<char> *)((long)&texCubeArraySize_1 + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&texCubeArraySize_1 + 3));
    texCubeDepth = *(int *)&colorFormats[(int)fmtName_1.field_2._12_4_].name;
    local_3fc = 0x14;
    local_400 = 6;
    pTVar5 = (TexImageCubeArrayBufferCase *)operator_new(0xf8);
    local_421 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format_1,
                   "_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TexImageCubeArrayBufferCase::TexImageCubeArrayBufferCase
              (pTVar5,pCVar1,pcVar4,"",texCubeDepth,0x14,6,0,0,0,0,0,4,0);
    local_421 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&ndx);
    std::__cxx11::string::~string((string *)&format_1);
  }
  for (local_428 = 0; local_428 < 7; local_428 = local_428 + 1) {
    pTVar5 = (TexImageCubeArrayBufferCase *)operator_new(0xf8);
    shadow3dGroup._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = init::parameterCases[local_428].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,pcVar4,(allocator<char> *)((long)&shadow3dGroup + 7));
    std::operator+(&local_448,&local_468,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    lVar6 = (long)local_428;
    TexImageCubeArrayBufferCase::TexImageCubeArrayBufferCase
              (pTVar5,pCVar1,pcVar4,"",init::parameterCases[lVar6].format,
               init::parameterCases[lVar6].size,init::parameterCases[lVar6].depth,
               init::parameterCases[lVar6].imageHeight,init::parameterCases[lVar6].rowLength,
               init::parameterCases[lVar6].skipImages,init::parameterCases[lVar6].skipRows,
               init::parameterCases[lVar6].skipPixels,init::parameterCases[lVar6].alignment,
               init::parameterCases[lVar6].offset);
    shadow3dGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)((long)&shadow3dGroup + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_depth","glTexImage3D() with depth or depth/stencil format");
  _texCubeArraySize_2 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (texCubeArrayDepth = 0; pTVar2 = _texCubeArraySize_2, texCubeArrayDepth < 5;
      texCubeArrayDepth = texCubeArrayDepth + 1) {
    local_480 = 0x40;
    local_484 = 6;
    pTVar3 = (TestNode *)operator_new(0xd8);
    shadow3dGroup_1._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = init::depthStencilFormats[texCubeArrayDepth].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,pcVar4,(allocator<char> *)((long)&shadow3dGroup_1 + 7));
    std::operator+(&local_4a8,&local_4c8,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TexImageCubeArrayDepthCase::TexImageCubeArrayDepthCase
              ((TexImageCubeArrayDepthCase *)pTVar3,pCVar1,pcVar4,"",
               init::depthStencilFormats[texCubeArrayDepth].internalFormat,0x40,6);
    shadow3dGroup_1._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&shadow3dGroup_1 + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_depth_pbo","glTexImage3D() with depth or depth/stencil format with pbo");
  _texCubeArraySize_3 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (texCubeArrayDepth_1 = 0; pTVar2 = _texCubeArraySize_3, texCubeArrayDepth_1 < 5;
      texCubeArrayDepth_1 = texCubeArrayDepth_1 + 1) {
    local_4e0 = 0x40;
    local_4e4 = 6;
    pTVar3 = (TestNode *)operator_new(0xd8);
    pboGroup_1._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = init::depthStencilFormats[texCubeArrayDepth_1].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,pcVar4,(allocator<char> *)((long)&pboGroup_1 + 7));
    std::operator+(&local_508,&local_528,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TexImageCubeArrayDepthBufferCase::TexImageCubeArrayDepthBufferCase
              ((TexImageCubeArrayDepthBufferCase *)pTVar3,pCVar1,pcVar4,"",
               init::depthStencilFormats[texCubeArrayDepth_1].internalFormat,0x40,6);
    pboGroup_1._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pboGroup_1 + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage3d_pbo","glTexSubImage3D() pixel buffer object tests");
  pTStack_538 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (local_53c = 0; pTVar2 = pTStack_538, local_53c < 0x31; local_53c = local_53c + 1) {
    pTVar7 = (TexSubImageCubeArrayBufferCase *)operator_new(0x110);
    local_582 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)&colorFormats[(long)local_53c + -1].internalFormat;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&ndx_4,pcVar4,&local_581);
    std::operator+(&local_560,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx_4,
                   "_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TexSubImageCubeArrayBufferCase::TexSubImageCubeArrayBufferCase
              (pTVar7,pCVar1,pcVar4,"",*(deUint32 *)&colorFormats[local_53c].name,0x1a,0xc,1,2,0,
               0x17,0x13,8,0,0,0,0,0,4,0);
    local_582 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&ndx_4);
    std::allocator<char>::~allocator(&local_581);
  }
  for (local_588 = 0; pTVar2 = pTStack_538, local_588 < 6; local_588 = local_588 + 1) {
    pTVar7 = (TexSubImageCubeArrayBufferCase *)operator_new(0x110);
    shadow3dGroup_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = init::paramCases[local_588].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,pcVar4,(allocator<char> *)((long)&shadow3dGroup_2 + 7));
    std::operator+(&local_5a8,&local_5c8,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    lVar6 = (long)local_588;
    TexSubImageCubeArrayBufferCase::TexSubImageCubeArrayBufferCase
              (pTVar7,pCVar1,pcVar4,"",init::paramCases[lVar6].format,init::paramCases[lVar6].size,
               init::paramCases[lVar6].depth,init::paramCases[lVar6].subX,
               init::paramCases[lVar6].subY,init::paramCases[lVar6].subZ,
               init::paramCases[lVar6].subW,init::paramCases[lVar6].subH,
               init::paramCases[lVar6].subD,init::paramCases[lVar6].imageHeight,
               init::paramCases[lVar6].rowLength,init::paramCases[lVar6].skipImages,
               init::paramCases[lVar6].skipRows,init::paramCases[lVar6].skipPixels,
               init::paramCases[lVar6].alignment,init::paramCases[lVar6].offset);
    shadow3dGroup_2._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&shadow3dGroup_2 + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage3d_depth","glTexSubImage3D() with depth or depth/stencil format");
  _texCubeArraySize_4 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (texCubeArrayLayers_1 = 0; pTVar2 = _texCubeArraySize_4, texCubeArrayLayers_1 < 5;
      texCubeArrayLayers_1 = texCubeArrayLayers_1 + 1) {
    local_5e0 = 0x39;
    local_5e4 = 6;
    pTVar3 = (TestNode *)operator_new(0xd8);
    texStorageGroup._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = init::depthStencilFormats[texCubeArrayLayers_1].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_628,pcVar4,(allocator<char> *)((long)&texStorageGroup + 7));
    std::operator+(&local_608,&local_628,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TexSubImageCubeArrayDepthCase::TexSubImageCubeArrayDepthCase
              ((TexSubImageCubeArrayDepthCase *)pTVar3,pCVar1,pcVar4,"",
               init::depthStencilFormats[texCubeArrayLayers_1].internalFormat,0x39,6);
    texStorageGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator((allocator<char> *)((long)&texStorageGroup + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texstorage3d"
             ,"Basic glTexStorage3D() usage");
  formatGroup = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "glTexStorage3D() with all formats");
  pTStack_640 = pTVar2;
  tcu::TestNode::addChild(&formatGroup->super_TestNode,pTVar2);
  for (fmtName_2._4_4_ = 0; fmtName_2._4_4_ < 0x31; fmtName_2._4_4_ = fmtName_2._4_4_ + 1) {
    _texCubeArraySize_5 = *(char **)&colorFormats[(long)fmtName_2._4_4_ + -1].internalFormat;
    texCubeArrayLayers_2 = *(int *)&colorFormats[fmtName_2._4_4_].name;
    texCubeArrayLevels = 0x39;
    local_65c = 6;
    local_660 = maxLevelCount(0x39);
    pTVar2 = pTStack_640;
    pTVar3 = (TestNode *)operator_new(0xd8);
    pcVar4 = _texCubeArraySize_5;
    fmtName_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&formatNdx_3,pcVar4,(allocator<char> *)((long)&fmtName_3 + 7));
    std::operator+(&local_680,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&formatNdx_3
                   ,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    BasicTexStorageCubeArrayCase::BasicTexStorageCubeArrayCase
              ((BasicTexStorageCubeArrayCase *)pTVar3,pCVar1,pcVar4,"",texCubeArrayLayers_2,0x39,6,
               local_660);
    fmtName_3._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&formatNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fmtName_3 + 7));
  }
  for (fmtName_3._0_4_ = 0; (int)fmtName_3 < 5; fmtName_3._0_4_ = (int)fmtName_3 + 1) {
    _texCubeArraySize_6 = init::depthStencilFormats[(int)fmtName_3].name;
    texCubeArrayLayers_3 = init::depthStencilFormats[(int)fmtName_3].internalFormat;
    texCubeArrayLevels_1 = 0x39;
    local_6bc = 6;
    local_6c0 = maxLevelCount(0x39);
    pTVar2 = pTStack_640;
    pTVar3 = (TestNode *)operator_new(0xd8);
    pcVar4 = _texCubeArraySize_6;
    sizeGroup._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,pcVar4,(allocator<char> *)((long)&sizeGroup + 7));
    std::operator+(&local_6e0,&local_700,"_cube_array");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    BasicTexStorageCubeArrayCase::BasicTexStorageCubeArrayCase
              ((BasicTexStorageCubeArrayCase *)pTVar3,pCVar1,pcVar4,"",texCubeArrayLayers_3,0x39,6,
               local_6c0);
    sizeGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sizeGroup + 7));
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"size",
             "glTexStorage3D() with various sizes");
  _format_2 = pTVar2;
  tcu::TestNode::addChild(&formatGroup->super_TestNode,pTVar2);
  size = 0;
  uVar8 = extraout_RAX;
  while (size < 7) {
    layers = 0x8058;
    levels = init::texCubeArraySizes[size].size;
    local_720 = init::texCubeArraySizes[size].layers;
    name.field_2._12_4_ = init::texCubeArraySizes[size].levels;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,"cube_array_",&local_849);
    de::toString<int>(&local_870,&levels);
    std::operator+(&local_828,&local_848,&local_870);
    std::operator+(&local_808,&local_828,"x");
    de::toString<int>(&local_890,&levels);
    std::operator+(&local_7e8,&local_808,&local_890);
    std::operator+(&local_7c8,&local_7e8,"x");
    de::toString<int>(&local_8b0,&local_720);
    std::operator+(&local_7a8,&local_7c8,&local_8b0);
    std::operator+(&local_788,&local_7a8,"_");
    de::toString<int>(&local_8d0,(int *)(name.field_2._M_local_buf + 0xc));
    std::operator+(&local_768,&local_788,&local_8d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748,
                   &local_768,"_levels");
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_870);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator(&local_849);
    pTVar2 = _format_2;
    pTVar3 = (TestNode *)operator_new(0xd8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    BasicTexStorageCubeArrayCase::BasicTexStorageCubeArrayCase
              ((BasicTexStorageCubeArrayCase *)pTVar3,pCVar1,pcVar4,"",0x8058,levels,local_720,
               name.field_2._12_4_);
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)local_748);
    size = size + 1;
    uVar8 = (ulong)(uint)size;
  }
  return (int)uVar8;
}

Assistant:

void TextureSpecificationTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} colorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} depthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	// Basic TexImage3D usage.
	{
		tcu::TestCaseGroup* basicTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_teximage3d", "Basic glTexImage3D() usage");
		addChild(basicTexImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const char*	fmtName				= colorFormats[formatNdx].name;
			deUint32	format				= colorFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayLayers	= 6;

			basicTexImageGroup->addChild(new BasicTexImageCubeArrayCase	(m_context,	(string(fmtName) + "_cube_array").c_str(),	"",	format, texCubeArraySize, texCubeArrayLayers));
		}
	}

	// glTexImage3D() pbo cases.
	{
		tcu::TestCaseGroup* pboGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_pbo", "glTexImage3D() from PBO");
		addChild(pboGroup);

		// Parameter cases
		static const struct
		{
			const char*	name;
			deUint32	format;
			int			size;
			int			depth;
			int			imageHeight;
			int			rowLength;
			int			skipImages;
			int			skipRows;
			int			skipPixels;
			int			alignment;
			int			offset;
		} parameterCases[] =
		{
			{ "rgb8_offset",		GL_RGB8,	23,	6,	0,	0,	0,	0,	0,	1,	67 },
			{ "rgb8_alignment",		GL_RGB8,	23,	6,	0,	0,	0,	0,	0,	2,	0 },
			{ "rgb8_image_height",	GL_RGB8,	23,	6,	26,	0,	0,	0,	0,	4,	0 },
			{ "rgb8_row_length",	GL_RGB8,	23,	6,	0,	27,	0,	0,	0,	4,	0 },
			{ "rgb8_skip_images",	GL_RGB8,	23,	6,	0,	0,	3,	0,	0,	4,	0 },
			{ "rgb8_skip_rows",		GL_RGB8,	23,	6,	26,	0,	0,	3,	0,	4,	0 },
			{ "rgb8_skip_pixels",	GL_RGB8,	23,	6,	0,	25,	0,	0,	2,	4,	0 }
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const string	fmtName				= colorFormats[formatNdx].name;
			const deUint32	format				= colorFormats[formatNdx].internalFormat;
			const int		texCubeArraySize	= 20;
			const int		texCubeDepth		= 6;

			pboGroup->addChild(new TexImageCubeArrayBufferCase	(m_context, (fmtName + "_cube_array").c_str(),	"", format, texCubeArraySize, texCubeDepth, 0, 0, 0, 0, 0, 4, 0));
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(parameterCases); ndx++)
		{
			pboGroup->addChild(new TexImageCubeArrayBufferCase(m_context, (string(parameterCases[ndx].name) + "_cube_array").c_str(), "",
														parameterCases[ndx].format,
														parameterCases[ndx].size,
														parameterCases[ndx].depth,
														parameterCases[ndx].imageHeight,
														parameterCases[ndx].rowLength,
														parameterCases[ndx].skipImages,
														parameterCases[ndx].skipRows,
														parameterCases[ndx].skipPixels,
														parameterCases[ndx].alignment,
														parameterCases[ndx].offset));
		}
	}

	// glTexImage3D() depth cases.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_depth", "glTexImage3D() with depth or depth/stencil format");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayDepth	= 6;

			shadow3dGroup->addChild(new TexImageCubeArrayDepthCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayDepth));
		}
	}

	// glTexImage3D() depth cases with pbo.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_depth_pbo", "glTexImage3D() with depth or depth/stencil format with pbo");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayDepth	= 6;

			shadow3dGroup->addChild(new TexImageCubeArrayDepthBufferCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayDepth));
		}
	}

	// glTexSubImage3D() PBO cases.
	{
		tcu::TestCaseGroup* pboGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage3d_pbo", "glTexSubImage3D() pixel buffer object tests");
		addChild(pboGroup);

		static const struct
		{
			const char*	name;
			deUint32	format;
			int			size;
			int			depth;
			int			subX;
			int			subY;
			int			subZ;
			int			subW;
			int			subH;
			int			subD;
			int			imageHeight;
			int			rowLength;
			int			skipImages;
			int			skipRows;
			int			skipPixels;
			int			alignment;
			int			offset;
		} paramCases[] =
		{
			{ "rgb8_offset",		GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	0,	0,	0,	0,	4,	67 },
			{ "rgb8_image_height",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	26,	0,	0,	0,	0,	4,	0 },
			{ "rgb8_row_length",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	27,	0,	0,	0,	4,	0 },
			{ "rgb8_skip_images",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	0,	3,	0,	0,	4,	0 },
			{ "rgb8_skip_rows",		GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	22,	0,	0,	3,	0,	4,	0 },
			{ "rgb8_skip_pixels",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	25,	0,	0,	2,	4,	0 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorFormats); ndx++)
		{
			pboGroup->addChild(new TexSubImageCubeArrayBufferCase(m_context, (std::string(colorFormats[ndx].name) + "_cube_array").c_str(), "",
														   colorFormats[ndx].internalFormat,
														   26,	// Size
														   12,	// Depth
														   1,	// Sub X
														   2,	// Sub Y
														   0,	// Sub Z
														   23,	// Sub W
														   19,	// Sub H
														   8,	// Sub D
														   0,	// Image height
														   0,	// Row length
														   0,	// Skip images
														   0,	// Skip rows
														   0,	// Skip pixels
														   4,	// Alignment
														   0	/* offset */));
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(paramCases); ndx++)
		{
			pboGroup->addChild(new TexSubImageCubeArrayBufferCase(m_context, (std::string(paramCases[ndx].name) + "_cube_array").c_str(), "",
														   paramCases[ndx].format,
														   paramCases[ndx].size,
														   paramCases[ndx].depth,
														   paramCases[ndx].subX,
														   paramCases[ndx].subY,
														   paramCases[ndx].subZ,
														   paramCases[ndx].subW,
														   paramCases[ndx].subH,
														   paramCases[ndx].subD,
														   paramCases[ndx].imageHeight,
														   paramCases[ndx].rowLength,
														   paramCases[ndx].skipImages,
														   paramCases[ndx].skipRows,
														   paramCases[ndx].skipPixels,
														   paramCases[ndx].alignment,
														   paramCases[ndx].offset));
		}
	}

	// glTexSubImage3D() depth cases.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage3d_depth", "glTexSubImage3D() with depth or depth/stencil format");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;

			shadow3dGroup->addChild(new TexSubImageCubeArrayDepthCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayLayers));
		}
	}

	// glTexStorage3D() cases.
	{
		tcu::TestCaseGroup* texStorageGroup = new tcu::TestCaseGroup(m_testCtx, "texstorage3d", "Basic glTexStorage3D() usage");
		addChild(texStorageGroup);

		// All formats.
		tcu::TestCaseGroup* formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "glTexStorage3D() with all formats");
		texStorageGroup->addChild(formatGroup);

		// Color formats.
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const char*	fmtName				= colorFormats[formatNdx].name;
			deUint32	internalFormat		= colorFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;
			int			texCubeArrayLevels	= maxLevelCount(texCubeArraySize);

			formatGroup->addChild(new BasicTexStorageCubeArrayCase	(m_context, (string(fmtName) + "_cube_array").c_str(),	"", internalFormat, texCubeArraySize, texCubeArrayLayers, texCubeArrayLevels));
		}

		// Depth/stencil formats (only 2D texture array is supported).
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); formatNdx++)
		{
			const char*	fmtName				= depthStencilFormats[formatNdx].name;
			deUint32	internalFormat		= depthStencilFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;
			int			texCubeArrayLevels	= maxLevelCount(texCubeArraySize);

			formatGroup->addChild(new BasicTexStorageCubeArrayCase	(m_context, (string(fmtName) + "_cube_array").c_str(),	"", internalFormat, texCubeArraySize, texCubeArrayLayers, texCubeArrayLevels));
		}

		// Sizes.
		static const struct
		{
			int				size;
			int				layers;
			int				levels;
		} texCubeArraySizes[] =
		{
			//	Sz	La	Le
			{	1,	6,	1 },
			{	2,	6,	2 },
			{	32,	6,	3 },
			{	64,	6,	4 },
			{	57,	12,	1 },
			{	57,	12,	2 },
			{	57,	12,	6 }
		};

		tcu::TestCaseGroup* sizeGroup = new tcu::TestCaseGroup(m_testCtx, "size", "glTexStorage3D() with various sizes");
		texStorageGroup->addChild(sizeGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(texCubeArraySizes); ndx++)
		{
			const deUint32		format		= GL_RGBA8;
			int					size		= texCubeArraySizes[ndx].size;
			int					layers		= texCubeArraySizes[ndx].layers;
			int					levels		= texCubeArraySizes[ndx].levels;
			string				name		= string("cube_array_") + de::toString(size) + "x" + de::toString(size) + "x" + de::toString(layers) + "_" + de::toString(levels) + "_levels";

			sizeGroup->addChild(new BasicTexStorageCubeArrayCase(m_context, name.c_str(), "", format, size, layers, levels));
		}
	}
}